

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O3

aom_codec_err_t
av1_get_target_seq_level_idx
          (SequenceHeader *seq_params,AV1LevelParams *level_params,int *target_seq_level_idx)

{
  bool bVar1;
  long lVar2;
  
  if (-1 < seq_params->operating_points_cnt_minus_1) {
    lVar2 = 0;
    do {
      target_seq_level_idx[lVar2] = 0x1f;
      if ((level_params->keep_level_stats >> ((uint)lVar2 & 0x1f) & 1) != 0) {
        target_seq_level_idx[lVar2] = (uint)level_params->target_seq_level_idx[lVar2];
      }
      bVar1 = lVar2 < seq_params->operating_points_cnt_minus_1;
      lVar2 = lVar2 + 1;
    } while (bVar1);
  }
  return AOM_CODEC_OK;
}

Assistant:

aom_codec_err_t av1_get_target_seq_level_idx(const SequenceHeader *seq_params,
                                             const AV1LevelParams *level_params,
                                             int *target_seq_level_idx) {
  for (int op = 0; op < seq_params->operating_points_cnt_minus_1 + 1; ++op) {
    target_seq_level_idx[op] = (int)SEQ_LEVEL_MAX;
    if (!((level_params->keep_level_stats >> op) & 1)) continue;
    target_seq_level_idx[op] = level_params->target_seq_level_idx[op];
  }

  return AOM_CODEC_OK;
}